

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O0

void kratos::InlineGeneratorVisitor::optimize_passthrough_assignment
               (Generator *gen,
               vector<kratos::InlineGeneratorVisitor::PortInfo,_std::allocator<kratos::InlineGeneratorVisitor::PortInfo>_>
               *stmts)

{
  pointer *this;
  Var *var_00;
  Var *this_00;
  bool bVar1;
  int iVar2;
  VarType VVar3;
  reference var_name;
  reference ppVVar4;
  undefined4 extraout_var;
  size_type sVar5;
  unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  *this_01;
  element_type *peVar6;
  Var **ppVVar7;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>,_false,_true>,_bool>
  pVar8;
  Var *right_1;
  Var *left_1;
  __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_168;
  value_type *src_stmt;
  Var *var;
  iterator __end2_2;
  iterator __begin2_2;
  vector<kratos::Var_*,_std::allocator<kratos::Var_*>_> *__range2_2;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>
  *iter;
  iterator __end2_1;
  iterator __begin2_1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>_>_>
  *__range2_1;
  RenameLinkedVar v;
  Var *local_a0;
  Var *right;
  Var *left;
  AssignStmt *stmt;
  PortInfo *info;
  const_iterator __end2;
  const_iterator __begin2;
  vector<kratos::InlineGeneratorVisitor::PortInfo,_std::allocator<kratos::InlineGeneratorVisitor::PortInfo>_>
  *__range2;
  vector<kratos::Var_*,_std::allocator<kratos::Var_*>_> vars;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>_>_>
  var_mapping;
  vector<kratos::InlineGeneratorVisitor::PortInfo,_std::allocator<kratos::InlineGeneratorVisitor::PortInfo>_>
  *stmts_local;
  Generator *gen_local;
  
  Generator::set_use_stmt_remove_cache(gen,true);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>_>_>
                   *)&vars.super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>._M_impl
                      .super__Vector_impl_data._M_end_of_storage);
  std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>::vector
            ((vector<kratos::Var_*,_std::allocator<kratos::Var_*>_> *)&__range2);
  __end2 = std::
           vector<kratos::InlineGeneratorVisitor::PortInfo,_std::allocator<kratos::InlineGeneratorVisitor::PortInfo>_>
           ::begin(stmts);
  info = (PortInfo *)
         std::
         vector<kratos::InlineGeneratorVisitor::PortInfo,_std::allocator<kratos::InlineGeneratorVisitor::PortInfo>_>
         ::end(stmts);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_kratos::InlineGeneratorVisitor::PortInfo_*,_std::vector<kratos::InlineGeneratorVisitor::PortInfo,_std::allocator<kratos::InlineGeneratorVisitor::PortInfo>_>_>
                                     *)&info), bVar1) {
    stmt = (AssignStmt *)
           __gnu_cxx::
           __normal_iterator<const_kratos::InlineGeneratorVisitor::PortInfo_*,_std::vector<kratos::InlineGeneratorVisitor::PortInfo,_std::allocator<kratos::InlineGeneratorVisitor::PortInfo>_>_>
           ::operator*(&__end2);
    left = (Var *)(stmt->super_Stmt).super_IRNode.fn_name_ln.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    ppVVar7 = AssignStmt::left((AssignStmt *)left);
    right = *ppVVar7;
    ppVVar7 = AssignStmt::right((AssignStmt *)left);
    local_a0 = *ppVVar7;
    if (*(int *)&(stmt->super_Stmt).super_IRNode._vptr_IRNode == 0) {
      Var::move_sink_to(right,local_a0,gen,false);
      (*(right->super_IRNode)._vptr_IRNode[0x12])(right,1);
      std::vector<kratos::Var*,std::allocator<kratos::Var*>>::emplace_back<kratos::Var*&>
                ((vector<kratos::Var*,std::allocator<kratos::Var*>> *)&__range2,&local_a0);
      std::
      unordered_map<std::__cxx11::string,kratos::Var*,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,kratos::Var*>>>
      ::emplace<std::__cxx11::string&,kratos::Var*&>
                ((unordered_map<std::__cxx11::string,kratos::Var*,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,kratos::Var*>>>
                  *)&vars.super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,&right->name,&local_a0);
    }
    else {
      Var::move_src_to(local_a0,right,gen,false);
      (*(local_a0->super_IRNode)._vptr_IRNode[0x11])(local_a0,1);
      std::vector<kratos::Var*,std::allocator<kratos::Var*>>::emplace_back<kratos::Var*&>
                ((vector<kratos::Var*,std::allocator<kratos::Var*>> *)&__range2,&right);
      pVar8 = std::
              unordered_map<std::__cxx11::string,kratos::Var*,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,kratos::Var*>>>
              ::emplace<std::__cxx11::string&,kratos::Var*&>
                        ((unordered_map<std::__cxx11::string,kratos::Var*,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,kratos::Var*>>>
                          *)&vars.super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,&local_a0->name,
                         &right);
      v.var_mapping_ =
           (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>_>_>
            *)pVar8.first.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>,_true>
              ._M_cur;
    }
    __gnu_cxx::
    __normal_iterator<const_kratos::InlineGeneratorVisitor::PortInfo_*,_std::vector<kratos::InlineGeneratorVisitor::PortInfo,_std::allocator<kratos::InlineGeneratorVisitor::PortInfo>_>_>
    ::operator++(&__end2);
  }
  RenameLinkedVar::RenameLinkedVar
            ((RenameLinkedVar *)&__range2_1,
             (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>_>_>
              *)&vars.super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage);
  IRVisitor::visit_content_s((IRVisitor *)&__range2_1,gen);
  this = &vars.super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage;
  __end2_1 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>_>_>
             ::begin((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>_>_>
                      *)this);
  iter = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>
          *)std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>_>_>
            ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>_>_>
                   *)this);
  while (bVar1 = std::__detail::operator!=
                           (&__end2_1.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>,_true>
                            ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>,_true>
                              *)&iter), bVar1) {
    var_name = std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>,_false,_true>
               ::operator*(&__end2_1);
    Generator::remove_var(gen,&var_name->first);
    std::__detail::
    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>,_false,_true>
    ::operator++(&__end2_1);
  }
  __end2_2 = std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>::begin
                       ((vector<kratos::Var_*,_std::allocator<kratos::Var_*>_> *)&__range2);
  var = (Var *)std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>::end
                         ((vector<kratos::Var_*,_std::allocator<kratos::Var_*>_> *)&__range2);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2_2,
                            (__normal_iterator<kratos::Var_**,_std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>_>
                             *)&var), bVar1) {
    ppVVar4 = __gnu_cxx::
              __normal_iterator<kratos::Var_**,_std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>_>
              ::operator*(&__end2_2);
    src_stmt = (value_type *)*ppVVar4;
    iVar2 = (*(((Var *)src_stmt)->super_IRNode)._vptr_IRNode[0x10])();
    sVar5 = std::
            unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
            ::size((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                    *)CONCAT44(extraout_var,iVar2));
    if (sVar5 == 1) {
      this_01 = (unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                 *)(*(code *)(((src_stmt->
                               super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr)->super_Stmt).parent_)();
      left_1 = (Var *)std::
                      unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                      ::begin(this_01);
      local_168 = (__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)std::__detail::
                     _Node_const_iterator<std::shared_ptr<kratos::AssignStmt>,_true,_false>::
                     operator*((_Node_const_iterator<std::shared_ptr<kratos::AssignStmt>,_true,_false>
                                *)&left_1);
      peVar6 = std::
               __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(local_168);
      ppVVar7 = AssignStmt::left(peVar6);
      var_00 = *ppVVar7;
      peVar6 = std::
               __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(local_168);
      ppVVar7 = AssignStmt::right(peVar6);
      this_00 = *ppVVar7;
      if ((var_00 == (Var *)src_stmt) &&
         ((VVar3 = Var::type(this_00), VVar3 == PortIO ||
          (VVar3 = Var::type(this_00), VVar3 == Base)))) {
        Var::move_sink_to(var_00,this_00,gen,false);
        (*(var_00->super_IRNode)._vptr_IRNode[0x12])(var_00,1);
        Generator::remove_var(gen,&var_00->name);
      }
    }
    __gnu_cxx::
    __normal_iterator<kratos::Var_**,_std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>_>::
    operator++(&__end2_2);
  }
  Generator::clear_remove_stmt_cache(gen);
  Generator::set_use_stmt_remove_cache(gen,false);
  RenameLinkedVar::~RenameLinkedVar((RenameLinkedVar *)&__range2_1);
  std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>::~vector
            ((vector<kratos::Var_*,_std::allocator<kratos::Var_*>_> *)&__range2);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>_>_>
  ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>_>_>
                    *)&vars.super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

static void optimize_passthrough_assignment(Generator* gen,
                                                const std::vector<PortInfo>& stmts) {
        gen->set_use_stmt_remove_cache(true);
        std::unordered_map<std::string, Var*> var_mapping;
        std::vector<Var*> vars;
        for (auto const& info : stmts) {
            auto* stmt = info.stmt;
            auto* left = stmt->left();
            auto* right = stmt->right();
            if (info.direction == PortDirection::In) {
                // move to right
                Var::move_sink_to(left, right, gen, false);
                left->clear_sources(true);
                vars.emplace_back(right);
                var_mapping.emplace(left->name, right);
            } else {
                // move to left
                Var::move_src_to(right, left, gen, false);
                right->clear_sinks(true);
                vars.emplace_back(left);
                var_mapping.emplace(right->name, left);
            }
        }

        // rename some constructs that's not assignments
        RenameLinkedVar v(var_mapping);
        v.visit_content_s(gen);
        // now remove them
        for (auto const& iter : var_mapping) {
            gen->remove_var(iter.first);
        }

        // also clear out variables with only one source
        // notice that we keep track of the ones need to check for performance reason
        for (auto* var : vars) {
            if (var->sources().size() != 1) {
                continue;
            }

            auto const& src_stmt = *var->sources().begin();
            auto* left = src_stmt->left();
            auto* right = src_stmt->right();
            if (left != var) continue;
            if (right->type() == VarType::PortIO || right->type() == VarType::Base) {
                // move
                VarSlice::move_sink_to(left, right, gen, false);
                left->clear_sources(true);
                gen->remove_var(left->name);
            }
        }

        gen->clear_remove_stmt_cache();
        gen->set_use_stmt_remove_cache(false);
    }